

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

Port * __thiscall rtosc::Ports::apropos(Ports *this,char *path)

{
  Port *pPVar1;
  Ports *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __n;
  Port *pPVar7;
  char *msg;
  Port *unaff_R12;
  Port *port;
  Port *pPVar8;
  char *path_end;
  char *local_38;
  
  msg = (char *)0x0;
  if (path != (char *)0x0) {
    msg = path + (*path == '/');
  }
  pPVar1 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar8 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                super__Vector_impl_data._M_start; bVar3 = pPVar8 == pPVar1, !bVar3;
      pPVar8 = pPVar8 + 1) {
    pcVar6 = pPVar8->name;
    pcVar5 = strchr(pcVar6,0x2f);
    bVar2 = true;
    if ((pcVar5 != (char *)0x0) &&
       (pcVar6 = rtosc_match_path(pcVar6,msg,&local_38), pcVar6 != (char *)0x0)) {
      this_00 = pPVar8->ports;
      if ((this_00 == (Ports *)0x0) || (pcVar6 = strchr(msg,0x2f), pcVar6[1] == '\0')) {
        bVar2 = false;
        unaff_R12 = pPVar8;
      }
      else {
        unaff_R12 = apropos(this_00,local_38);
        bVar2 = false;
      }
    }
    if (!bVar2) break;
  }
  if (bVar3) {
    pPVar1 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar8 = (this->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
                  _M_impl.super__Vector_impl_data._M_start; pPVar8 != pPVar1; pPVar8 = pPVar8 + 1) {
      if (*msg == '\0') {
LAB_00106a86:
        bVar3 = true;
        pPVar7 = unaff_R12;
      }
      else {
        pcVar6 = pPVar8->name;
        __n = strlen(msg);
        iVar4 = strncmp(pcVar6,msg,__n);
        bVar3 = false;
        pPVar7 = pPVar8;
        if ((iVar4 != 0) &&
           (pcVar6 = rtosc_match_path(pcVar6,msg,(char **)0x0), pcVar6 == (char *)0x0))
        goto LAB_00106a86;
      }
      if (!bVar3) {
        return pPVar7;
      }
      unaff_R12 = pPVar7;
    }
    unaff_R12 = (Port *)0x0;
  }
  return unaff_R12;
}

Assistant:

const Port *Ports::apropos(const char *path) const
{
    if(path && path[0] == '/')
        ++path;

    const char* path_end;
    for(const Port &port: ports)
        if(strchr(port.name,'/') && rtosc_match_path(port.name,path, &path_end))
            return (port.ports && strchr(path,'/')[1])
                ? port.ports->apropos(path_end)
                : &port;

    //This is the lowest level, now find the best port
    for(const Port &port: ports)
        if(*path && (strstr(port.name, path)==port.name ||
                    rtosc_match_path(port.name, path, NULL)))
            return &port;

    return NULL;
}